

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>::
operator()(QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>
           *this,idx_t *input)

{
  MadAccessor<int,_int,_int> *this_00;
  RESULT_TYPE_conflict1 RVar1;
  RESULT_TYPE_conflict1 local_c;
  
  this_00 = this->outer;
  local_c = QuantileIndirect<int>::operator()(this->inner,input);
  RVar1 = MadAccessor<int,_int,_int>::operator()(this_00,&local_c);
  return RVar1;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}